

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createGarbageSubdivMesh
          (SceneGraph *this,int hash,size_t numFaces,bool mblur,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  pointer *ppuVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  iterator iVar4;
  pointer pvVar5;
  ulong uVar6;
  Vec3fa *pVVar7;
  undefined8 uVar8;
  ulong uVar9;
  Node *pNVar10;
  uint uVar11;
  int iVar12;
  SubdivMeshNode *this_00;
  Vec3fa *pVVar13;
  long lVar14;
  int iVar15;
  undefined7 in_register_00000009;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  uint uVar21;
  uint f;
  uint local_70;
  undefined4 local_6c;
  Ref<embree::SceneGraph::MaterialNode> local_68;
  uint local_5c;
  size_t local_58;
  Node *local_50;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_48;
  size_t local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000009,mblur);
  local_58 = numFaces;
  local_50 = (Node *)this;
  this_00 = (SubdivMeshNode *)operator_new(0x1b0);
  local_68 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_68.ptr != (MaterialNode *)0x0) {
    (*((local_68.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  SubdivMeshNode::SubdivMeshNode
            (this_00,&local_68,(BBox1f)0x3f80000000000000,(ulong)(byte)local_6c + 1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_68.ptr != (MaterialNode *)0x0) {
    (*((local_68.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  if (local_58 != 0) {
    uVar11 = (uint)(hash * -0x3361d2af) >> 0x11 | hash * 0x16a88000;
    uVar11 = (uVar11 * -0x194da000 | uVar11 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
    uVar11 = (uVar11 >> 0x10 ^ uVar11) * -0x7a143595;
    uVar11 = (uVar11 >> 0xd ^ uVar11) * -0x3d4d51cb;
    uVar11 = uVar11 >> 0x10 ^ uVar11;
    local_48 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this_00->verticesPerFace;
    local_38 = &this_00->position_indices;
    sVar19 = 0;
    do {
      uVar11 = uVar11 * 0x19660d + 0x3c6ef35f;
      local_70 = (uVar11 >> 1) % 0x14;
      iVar4._M_current =
           (this_00->verticesPerFace).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this_00->verticesPerFace).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_48,iVar4,&local_70);
      }
      else {
        *iVar4._M_current = local_70;
        ppuVar1 = &(this_00->verticesPerFace).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      local_40 = sVar19;
      if (local_70 != 0) {
        uVar20 = 0;
        do {
          uVar21 = uVar11 * 0x19660d + 0x3c6ef35f;
          if ((uVar21 & 0x3e) == 0) {
            uVar21 = uVar21 * 0x19660d + 0x3c6ef35f;
            local_5c = uVar21;
          }
          else {
            local_5c = (uint)((this_00->positions).
                              super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->size_active;
          }
          iVar4._M_current =
               (this_00->position_indices).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this_00->position_indices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(local_38,iVar4,&local_5c);
          }
          else {
            *iVar4._M_current = local_5c;
            ppuVar1 = &(this_00->position_indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          pvVar5 = (this_00->positions).
                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          sVar19 = pvVar5->size_active;
          uVar6 = pvVar5->size_alloced;
          uVar16 = sVar19 + 1;
          uVar18 = uVar6;
          if ((uVar6 < uVar16) && (uVar18 = uVar16, uVar9 = uVar6, uVar6 != 0)) {
            for (; uVar18 = uVar9, uVar9 < uVar16; uVar9 = uVar9 * 2 + (ulong)(uVar9 * 2 == 0)) {
            }
          }
          if (uVar6 != uVar18) {
            pVVar7 = pvVar5->items;
            pVVar13 = (Vec3fa *)alignedMalloc(uVar18 << 4,0x10);
            pvVar5->items = pVVar13;
            if (pvVar5->size_active != 0) {
              lVar14 = 0;
              uVar16 = 0;
              do {
                puVar2 = (undefined8 *)((long)&pVVar7->field_0 + lVar14);
                uVar8 = puVar2[1];
                puVar3 = (undefined8 *)((long)&pvVar5->items->field_0 + lVar14);
                *puVar3 = *puVar2;
                puVar3[1] = uVar8;
                uVar16 = uVar16 + 1;
                lVar14 = lVar14 + 0x10;
              } while (uVar16 < pvVar5->size_active);
            }
            alignedFree(pVVar7);
            pvVar5->size_active = sVar19;
            pvVar5->size_alloced = uVar18;
          }
          uVar11 = uVar21 * 0x979e791 + 0xaaf95334;
          sVar19 = pvVar5->size_active;
          pVVar7 = pvVar5->items;
          pvVar5->size_active = sVar19 + 1;
          *(ulong *)&pVVar7[sVar19].field_0 =
               CONCAT44(uVar21 * 0x17385ca9 + 0x47502932,uVar21 * 0x19660d + 0x3c6ef35f);
          *(ulong *)((long)&pVVar7[sVar19].field_0 + 8) =
               CONCAT44(uVar11,uVar21 * -0x50b6f56b + -0x2e330917);
          if ((byte)local_6c != '\0') {
            pvVar5 = (this_00->positions).
                     super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            sVar19 = pvVar5[1].size_active;
            uVar6 = pvVar5[1].size_alloced;
            uVar16 = sVar19 + 1;
            uVar18 = uVar6;
            if ((uVar6 < uVar16) && (uVar18 = uVar16, uVar9 = uVar6, uVar6 != 0)) {
              for (; uVar18 = uVar9, uVar9 < uVar16; uVar9 = uVar9 * 2 + (ulong)(uVar9 * 2 == 0)) {
              }
            }
            if (uVar6 != uVar18) {
              pVVar7 = pvVar5[1].items;
              pVVar13 = (Vec3fa *)alignedMalloc(uVar18 << 4,0x10);
              pvVar5[1].items = pVVar13;
              if (pvVar5[1].size_active != 0) {
                lVar14 = 0;
                uVar16 = 0;
                do {
                  puVar2 = (undefined8 *)((long)&pVVar7->field_0 + lVar14);
                  uVar8 = puVar2[1];
                  puVar3 = (undefined8 *)((long)&(pvVar5[1].items)->field_0 + lVar14);
                  *puVar3 = *puVar2;
                  puVar3[1] = uVar8;
                  uVar16 = uVar16 + 1;
                  lVar14 = lVar14 + 0x10;
                } while (uVar16 < pvVar5[1].size_active);
              }
              alignedFree(pVVar7);
              pvVar5[1].size_active = sVar19;
              pvVar5[1].size_alloced = uVar18;
            }
            iVar12 = uVar11 * 0x19660d;
            iVar15 = uVar11 * 0x17385ca9;
            iVar17 = uVar11 * -0x50b6f56b;
            uVar11 = uVar11 * 0x979e791 + 0xaaf95334;
            sVar19 = pvVar5[1].size_active;
            pVVar7 = pvVar5[1].items;
            pvVar5[1].size_active = sVar19 + 1;
            *(ulong *)&pVVar7[sVar19].field_0 = CONCAT44(iVar15 + 0x47502932,iVar12 + 0x3c6ef35f);
            *(ulong *)((long)&pVVar7[sVar19].field_0 + 8) = CONCAT44(uVar11,iVar17 + -0x2e330917);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 < local_70);
      }
      sVar19 = local_40 + 1;
    } while (sVar19 != local_58);
  }
  pNVar10 = local_50;
  (local_50->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)pNVar10;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGarbageSubdivMesh (int hash, size_t numFaces, bool mblur, Ref<MaterialNode> material)
  {
    RandomSampler sampler;
    RandomSampler_init(sampler,hash);
    Ref<SceneGraph::SubdivMeshNode> mesh = new SceneGraph::SubdivMeshNode(material,BBox1f(0,1),mblur?2:1);

    for (size_t i=0; i<numFaces; i++) 
    {
      const unsigned f = RandomSampler_getInt(sampler) % 20;
      mesh->verticesPerFace.push_back(f);
      for (size_t j=0; j<f; j++) 
      {
        mesh->position_indices.push_back((RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(mesh->numPositions()));

        const float x = cast_i2f(RandomSampler_getUInt(sampler));
        const float y = cast_i2f(RandomSampler_getUInt(sampler));
        const float z = cast_i2f(RandomSampler_getUInt(sampler));
        const float w = cast_i2f(RandomSampler_getUInt(sampler));
        mesh->positions[0].push_back(Vec3fa(Vec3ff(x,y,z,w)));

        if (mblur) 
        {
          const float x = cast_i2f(RandomSampler_getUInt(sampler));
          const float y = cast_i2f(RandomSampler_getUInt(sampler));
          const float z = cast_i2f(RandomSampler_getUInt(sampler));
          const float w = cast_i2f(RandomSampler_getUInt(sampler));
          mesh->positions[1].push_back(Vec3fa(Vec3ff(x,y,z,w)));
        }
      }
    }

    return mesh.dynamicCast<SceneGraph::Node>();
  }